

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O3

void dumb_remove_clicks_array
               (int n,DUMB_CLICK_REMOVER **cr,sample_t_conflict **samples,int32 length,
               double halflife)

{
  long lVar1;
  uint uVar2;
  
  if (cr != (DUMB_CLICK_REMOVER **)0x0) {
    uVar2 = n >> 1;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    else {
      lVar1 = 0;
      do {
        dumb_remove_clicks(*(DUMB_CLICK_REMOVER **)((long)cr + lVar1 * 2),
                           *(sample_t_conflict **)((long)samples + lVar1),length,2,halflife);
        dumb_remove_clicks(*(DUMB_CLICK_REMOVER **)((long)cr + lVar1 * 2 + 8),
                           (sample_t_conflict *)(*(long *)((long)samples + lVar1) + 4),length,2,
                           halflife);
        lVar1 = lVar1 + 8;
      } while ((ulong)uVar2 << 3 != lVar1);
    }
    if ((n & 1U) != 0) {
      dumb_remove_clicks(cr[uVar2 * 2],samples[uVar2],length,1,halflife);
      return;
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks_array(int n, DUMB_CLICK_REMOVER **cr, sample_t **samples, int32 length, double halflife)
{
	if (cr) {
		int i;
		for (i = 0; i < n >> 1; i++) {
			dumb_remove_clicks(cr[i << 1], samples[i], length, 2, halflife);
			dumb_remove_clicks(cr[(i << 1) + 1], samples[i] + 1, length, 2, halflife);
		}
		if (n & 1)
			dumb_remove_clicks(cr[i << 1], samples[i], length, 1, halflife);
	}
}